

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gymplayer.cpp
# Opt level: O2

string * __thiscall
GYMPlayer::GetUTF8String_abi_cxx11_
          (string *__return_storage_ptr__,GYMPlayer *this,char *startPtr,char *endPtr)

{
  CPCONV *cpc;
  UINT8 UVar1;
  char *convData;
  size_t convSize;
  char *local_30;
  size_t local_28;
  
  if (startPtr == endPtr) {
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    __return_storage_ptr__->_M_string_length = 0;
    (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
  }
  else {
    cpc = this->_cpc1252;
    if (cpc != (CPCONV *)0x0) {
      local_28 = 0;
      local_30 = (char *)0x0;
      (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
      __return_storage_ptr__->_M_string_length = 0;
      (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
      UVar1 = CPConv_StrConvert(cpc,&local_28,&local_30,(long)endPtr - (long)startPtr,startPtr);
      std::__cxx11::string::assign<char*,void>
                ((string *)__return_storage_ptr__,local_30,local_30 + local_28);
      free(local_30);
      if (-1 < (char)UVar1) {
        return __return_storage_ptr__;
      }
      std::__cxx11::string::~string((string *)__return_storage_ptr__);
    }
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)__return_storage_ptr__,startPtr,endPtr);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string GYMPlayer::GetUTF8String(const char* startPtr, const char* endPtr)
{
	if (startPtr == endPtr)
		return std::string();
	
	if (_cpc1252 != NULL)
	{
		size_t convSize = 0;
		char* convData = NULL;
		std::string result;
		UINT8 retVal;
		
		retVal = CPConv_StrConvert(_cpc1252, &convSize, &convData, endPtr - startPtr, startPtr);
		
		result.assign(convData, convData + convSize);
		free(convData);
		if (retVal < 0x80)
			return result;
	}
	// unable to convert - fallback using the original string
	return std::string(startPtr, endPtr);
}